

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

shared_ptr<void> *
pstore::storage::segment_base_impl<pstore::storage,std::shared_ptr<void>const&>
          (storage *storage,segment_type segment)

{
  bool bVar1;
  pointer this;
  size_type sVar2;
  type this_00;
  reference this_01;
  sat_entry *e;
  segment_type segment_local;
  storage *storage_local;
  
  this = std::
         unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
         ::operator->(&storage->sat_);
  sVar2 = std::array<pstore::sat_entry,_65536UL>::size(this);
  if (sVar2 <= segment) {
    assert_failed("segment < storage.sat_->size ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                  ,0x107);
  }
  this_00 = std::
            unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
            ::operator*(&storage->sat_);
  this_01 = std::array<pstore::sat_entry,_65536UL>::operator[](this_00,(ulong)segment);
  bVar1 = sat_entry::is_valid(this_01);
  if (!bVar1) {
    assert_failed("e.is_valid ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                  ,0x109);
  }
  return &this_01->value;
}

Assistant:

inline auto storage::segment_base_impl (Storage & storage,
                                            address::segment_type const segment) noexcept
        -> ResultType {
        PSTORE_ASSERT (segment < storage.sat_->size ());
        sat_entry & e = (*storage.sat_)[segment];
        PSTORE_ASSERT (e.is_valid ());
        return e.value;
    }